

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_glnodes.cpp
# Opt level: O1

void Cmd_clearnodecache(FCommandLine *argv,APlayerPawn *who,int key)

{
  char *__filename;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  FString path;
  TArray<FFileList,_FFileList> list;
  FString local_30;
  TArray<FFileList,_FFileList> local_28;
  
  local_28.Array = (FFileList *)0x0;
  local_28.Most = 0;
  local_28.Count = 0;
  M_GetCachePath(SUB81(&local_30,0));
  FString::operator+=(&local_30,"/");
  ScanDirectory(&local_28,local_30.Chars);
  uVar2 = local_28.Count - 1;
  if (-1 < (int)uVar2) {
    uVar3 = (ulong)uVar2 << 4 | 8;
    lVar4 = (ulong)uVar2 + 1;
    do {
      __filename = *(char **)((long)local_28.Array + (uVar3 - 8));
      if (*(char *)((long)&((local_28.Array)->Filename).Chars + uVar3) == '\x01') {
        rmdir(__filename);
      }
      else {
        remove(__filename);
      }
      uVar3 = uVar3 - 0x10;
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  FString::~FString(&local_30);
  TArray<FFileList,_FFileList>::~TArray(&local_28);
  return;
}

Assistant:

static int CheckForMissingSegs()
{
	double *added_seglen = new double[numsides];
	int missing = 0;

	memset(added_seglen, 0, sizeof(double)*numsides);
	for(int i=0;i<numsegs;i++)
	{
		seg_t * seg = &segs[i];

		if (seg->sidedef!=NULL)
		{
			// check all the segs and calculate the length they occupy on their sidedef
			DVector2 vec1(seg->v2->fX() - seg->v1->fX(), seg->v2->fY() - seg->v1->fY());
			added_seglen[seg->sidedef - sides] += vec1.Length();
		}
	}

	for(int i=0;i<numsides;i++)
	{
		double linelen = sides[i].linedef->Delta().Length();
		missing += (added_seglen[i] < linelen - 1.);
	}

	delete [] added_seglen;
	return missing;
}